

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O1

int SUNNonlinSolSolve_Newton
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,sunrealtype tol,
              int callLSetup,void *mem)

{
  long *plVar1;
  void *pvVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  bool bVar8;
  
  pvVar2 = NLS->content;
  uVar3 = *(undefined8 *)((long)pvVar2 + 0x20);
  *(undefined8 *)((long)pvVar2 + 0x38) = 0;
  *(undefined8 *)((long)pvVar2 + 0x40) = 0;
  puVar4 = (undefined8 *)NLS->content;
  *(undefined4 *)((long)puVar4 + 0x2c) = 0;
  iVar5 = (*(code *)*puVar4)(ycor,uVar3,mem);
  if (iVar5 == 0) {
    bVar8 = callLSetup == 0;
    uVar7 = 0;
    while ((bVar8 || (iVar5 = (**(code **)((long)NLS->content + 8))
                                        (uVar7,(long)NLS->content + 0x28,mem), iVar5 == 0))) {
      do {
        plVar1 = (long *)((long)NLS->content + 0x38);
        *plVar1 = *plVar1 + 1;
        N_VScale(0,uVar3,uVar3);
        iVar5 = (**(code **)((long)NLS->content + 0x10))(uVar3,mem);
        if (iVar5 != 0) break;
        N_VLinearSum(0,0,ycor,uVar3,ycor);
        iVar5 = (**(code **)((long)NLS->content + 0x18))
                          (SUB84(tol,0),NLS,ycor,uVar3,w,*(undefined8 *)((long)NLS->content + 0x48))
        ;
        puVar4 = (undefined8 *)NLS->content;
        iVar6 = *(int *)((long)puVar4 + 0x2c) + 1;
        *(int *)((long)puVar4 + 0x2c) = iVar6;
        if (iVar5 != 0x385) {
          if (iVar5 == 0) {
            *(undefined4 *)(puVar4 + 5) = 0;
            return 0;
          }
          break;
        }
        if (*(int *)(puVar4 + 6) <= iVar6) {
          iVar5 = 0x386;
          break;
        }
        iVar5 = (*(code *)*puVar4)(ycor,uVar3,mem);
      } while (iVar5 == 0);
      if (((iVar5 < 1) || (pvVar2 = NLS->content, *(int *)((long)pvVar2 + 0x28) != 0)) ||
         (*(long *)((long)pvVar2 + 8) == 0)) break;
      *(long *)((long)pvVar2 + 0x40) = *(long *)((long)pvVar2 + 0x40) + 1;
      N_VConst(0,ycor);
      puVar4 = (undefined8 *)NLS->content;
      *(undefined4 *)((long)puVar4 + 0x2c) = 0;
      iVar5 = (*(code *)*puVar4)(ycor,uVar3,mem);
      uVar7 = 1;
      bVar8 = false;
      if (iVar5 != 0) break;
    }
  }
  plVar1 = (long *)((long)NLS->content + 0x40);
  *plVar1 = *plVar1 + 1;
  return iVar5;
}

Assistant:

int SUNNonlinSolSolve_Newton(SUNNonlinearSolver NLS,
                             SUNDIALS_MAYBE_UNUSED N_Vector y0, N_Vector ycor,
                             N_Vector w, sunrealtype tol,
                             sunbooleantype callLSetup, void* mem)
{
  SUNFunctionBegin(NLS->sunctx);
  /* local variables */
  int retval;
  sunbooleantype jbad;
  N_Vector delta;

  /* check that all required function pointers have been set */
  SUNAssert(NEWTON_CONTENT(NLS)->Sys && NEWTON_CONTENT(NLS)->CTest &&
              NEWTON_CONTENT(NLS)->LSolve,
            SUN_ERR_ARG_CORRUPT);
  SUNAssert(!callLSetup || (callLSetup && NEWTON_CONTENT(NLS)->LSetup),
            SUN_ERR_ARG_CORRUPT);

  /* set local shortcut variables */
  delta = NEWTON_CONTENT(NLS)->delta;

  /* assume the Jacobian is good */
  jbad = SUNFALSE;

  /* initialize iteration and convergence fail counters for this solve */
  NEWTON_CONTENT(NLS)->niters     = 0;
  NEWTON_CONTENT(NLS)->nconvfails = 0;

  /* looping point for attempts at solution of the nonlinear system:
       Evaluate the nonlinear residual function (store in delta)
       Setup the linear solver if necessary
       Preform Newton iteraion */
  for (;;)
  {
    /* initialize current iteration counter for this solve attempt */
    NEWTON_CONTENT(NLS)->curiter = 0;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO, __func__,
                       "begin-attempt", "iter = %ld, nni = %ld",
                       (long int)NEWTON_CONTENT(NLS)->curiter,
                       NEWTON_CONTENT(NLS)->niters);
    SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO, __func__,
                       "start-iterate", "iter = %ld, nni = %ld",
                       (long int)NEWTON_CONTENT(NLS)->curiter,
                       NEWTON_CONTENT(NLS)->niters);
#endif

    /* compute the nonlinear residual, store in delta */
    retval = NEWTON_CONTENT(NLS)->Sys(ycor, delta, mem);
    if (retval != SUN_SUCCESS) { break; }

    /* if indicated, setup the linear system */
    if (callLSetup)
    {
      retval = NEWTON_CONTENT(NLS)->LSetup(jbad, &(NEWTON_CONTENT(NLS)->jcur),
                                           mem);
      if (retval != SUN_SUCCESS) { break; }
    }

    /* looping point for Newton iteration. Break out on any error. */
    for (;;)
    {
      /* increment nonlinear solver iteration counter */
      NEWTON_CONTENT(NLS)->niters++;

      /* compute the negative of the residual for the linear system rhs */
      N_VScale(-ONE, delta, delta);
      SUNCheckLastErr();

      /* solve the linear system to get Newton update delta */
      retval = NEWTON_CONTENT(NLS)->LSolve(delta, mem);
      if (retval != SUN_SUCCESS) { break; }

      /* update the Newton iterate */
      N_VLinearSum(ONE, ycor, ONE, delta, ycor);
      SUNCheckLastErr();

      /* test for convergence */
      retval = NEWTON_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                          NEWTON_CONTENT(NLS)->ctest_data);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
      SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO, __func__,
                         "end-iterate", "iter = %ld, nni = %ld, wrmsnorm = %.16g",
                         NEWTON_CONTENT(NLS)->curiter,
                         NEWTON_CONTENT(NLS)->niters - 1, N_VWrmsNorm(delta, w));
#endif

      /* Update here so begin/end logging iterations match */
      NEWTON_CONTENT(NLS)->curiter++;

      /* if successful update Jacobian status and return */
      if (retval == SUN_SUCCESS)
      {
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
        SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO, __func__,
                           "end-attempt", "success, iter = %ld, nni = %ld",
                           (long int)NEWTON_CONTENT(NLS)->curiter,
                           NEWTON_CONTENT(NLS)->niters);
#endif
        NEWTON_CONTENT(NLS)->jcur = SUNFALSE;
        return SUN_SUCCESS;
      }

      /* check if the iteration should continue; otherwise exit Newton loop */
      if (retval != SUN_NLS_CONTINUE) { break; }

      /* not yet converged, test for max allowed iterations. */
      if (NEWTON_CONTENT(NLS)->curiter >= NEWTON_CONTENT(NLS)->maxiters)
      {
        retval = SUN_NLS_CONV_RECVR;
        break;
      }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
      SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO, __func__,
                         "start-iterate", "iter = %ld, nni = %ld",
                         (long int)NEWTON_CONTENT(NLS)->curiter,
                         NEWTON_CONTENT(NLS)->niters);
#endif

      /* compute the nonlinear residual, store in delta */
      retval = NEWTON_CONTENT(NLS)->Sys(ycor, delta, mem);
      if (retval != SUN_SUCCESS) { break; }

    } /* end of Newton iteration loop */

    /* all errors go here */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO, __func__,
                       "end-attempt", "failure, iter = %ld, nni = %ld",
                       (long int)NEWTON_CONTENT(NLS)->curiter,
                       NEWTON_CONTENT(NLS)->niters);
#endif

    /* If there is a recoverable convergence failure and the Jacobian-related
       data appears not to be current, increment the convergence failure count,
       reset the initial correction to zero, and loop again with a call to
       lsetup in which jbad is TRUE. Otherwise break out and return. */
    if ((retval > 0) && !(NEWTON_CONTENT(NLS)->jcur) &&
        (NEWTON_CONTENT(NLS)->LSetup))
    {
      NEWTON_CONTENT(NLS)->nconvfails++;
      callLSetup = SUNTRUE;
      jbad       = SUNTRUE;
      N_VConst(ZERO, ycor);
      SUNCheckLastErr();
      continue;
    }
    else { break; }

  } /* end of setup loop */

  /* increment number of convergence failures */
  NEWTON_CONTENT(NLS)->nconvfails++;

  /* all error returns exit here */
  return (retval);
}